

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall dynet::AdagradTrainer::alloc_impl(AdagradTrainer *this)

{
  _Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> _Stack_28;
  
  allocate_shadow_parameters
            ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)&_Stack_28
             ,(this->super_Trainer).model);
  std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::_M_move_assign
            (&this->vp,&_Stack_28);
  std::_Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::
  ~_Vector_base(&_Stack_28);
  allocate_shadow_lookup_parameters
            ((vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
              *)&_Stack_28,(this->super_Trainer).model);
  std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
  _M_move_assign(&this->vlp,&_Stack_28);
  std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
  ~vector((vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_> *)
          &_Stack_28);
  return;
}

Assistant:

void AdagradTrainer::alloc_impl() {
  vp = allocate_shadow_parameters(*model);
  vlp = allocate_shadow_lookup_parameters(*model);
}